

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

void __thiscall booster::log::sinks::syslog::syslog(syslog *this,int __pri,char *__fmt,...)

{
  data *pdVar1;
  
  (this->super_sink)._vptr_sink = (_func_int **)&PTR_log_001cf4d8;
  pdVar1 = (data *)operator_new(0x28);
  (pdVar1->id)._M_dataplus._M_p = (pointer)&(pdVar1->id).field_2;
  (pdVar1->id)._M_string_length = 0;
  (pdVar1->id).field_2._M_local_buf[0] = '\0';
  pdVar1->log_was_opened = false;
  (this->d).ptr_ = pdVar1;
  return;
}

Assistant:

syslog::syslog() : d(new data())
		{
		}